

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QByteArray,QByteArray>>::emplace<QByteArray_const&,QByteArray>
          (QMovableArrayOps<std::pair<QByteArray,QByteArray>> *this,qsizetype i,QByteArray *args,
          QByteArray *args_1)

{
  long *plVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  Data *pDVar5;
  char *pcVar6;
  Data *pDVar7;
  char *pcVar8;
  long lVar9;
  long lVar10;
  qsizetype qVar11;
  long lVar12;
  
  piVar2 = *(int **)this;
  if ((piVar2 != (int *)0x0) && (*piVar2 < 2)) {
    if ((*(long *)(this + 0x10) == i) &&
       (lVar3 = *(long *)(this + 8),
       *(long *)(piVar2 + 2) - i !=
       ((long)(lVar3 - ((long)piVar2 + 0x1fU & 0xfffffffffffffff0)) >> 4) * -0x5555555555555555)) {
      lVar12 = i * 0x30;
      lVar9 = lVar3 + lVar12;
      pDVar5 = (args->d).d;
      *(Data **)(lVar3 + lVar12) = pDVar5;
      *(char **)(lVar3 + 8 + lVar12) = (args->d).ptr;
      *(qsizetype *)(lVar3 + 0x10 + lVar12) = (args->d).size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar5 = (args_1->d).d;
      (args_1->d).d = (Data *)0x0;
      *(Data **)(lVar9 + 0x18) = pDVar5;
      pcVar6 = (args_1->d).ptr;
      (args_1->d).ptr = (char *)0x0;
      *(char **)(lVar9 + 0x20) = pcVar6;
      qVar11 = (args_1->d).size;
      (args_1->d).size = 0;
      *(qsizetype *)(lVar9 + 0x28) = qVar11;
      goto LAB_001a210c;
    }
    if ((i == 0) &&
       (uVar4 = *(ulong *)(this + 8), ((long)piVar2 + 0x1fU & 0xfffffffffffffff0) != uVar4)) {
      pDVar5 = (args->d).d;
      *(Data **)(uVar4 - 0x30) = pDVar5;
      *(char **)(uVar4 - 0x28) = (args->d).ptr;
      *(qsizetype *)(uVar4 - 0x20) = (args->d).size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar5 = (args_1->d).d;
      (args_1->d).d = (Data *)0x0;
      *(Data **)(uVar4 - 0x18) = pDVar5;
      pcVar6 = (args_1->d).ptr;
      (args_1->d).ptr = (char *)0x0;
      *(char **)(uVar4 - 0x10) = pcVar6;
      qVar11 = (args_1->d).size;
      (args_1->d).size = 0;
      *(qsizetype *)(uVar4 - 8) = qVar11;
      *(long *)(this + 8) = *(long *)(this + 8) + -0x30;
      goto LAB_001a210c;
    }
  }
  pDVar5 = (args->d).d;
  pcVar6 = (args->d).ptr;
  lVar3 = (args->d).size;
  if (pDVar5 != (Data *)0x0) {
    LOCK();
    (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pDVar7 = (args_1->d).d;
  pcVar8 = (args_1->d).ptr;
  (args_1->d).d = (Data *)0x0;
  (args_1->d).ptr = (char *)0x0;
  lVar9 = (args_1->d).size;
  (args_1->d).size = 0;
  lVar12 = *(long *)(this + 0x10);
  QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>::detachAndGrow
            ((QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *)this,
             (uint)(i == 0 && lVar12 != 0),1,(pair<QByteArray,_QByteArray> **)0x0,
             (QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *)0x0);
  lVar10 = *(long *)(this + 8);
  if (i == 0 && lVar12 != 0) {
    *(Data **)(lVar10 + -0x30) = pDVar5;
    *(char **)(lVar10 + -0x28) = pcVar6;
    *(long *)(lVar10 + -0x20) = lVar3;
    *(Data **)(lVar10 + -0x18) = pDVar7;
    *(char **)(lVar10 + -0x10) = pcVar8;
    *(long *)(lVar10 + -8) = lVar9;
    *(long *)(this + 8) = lVar10 + -0x30;
  }
  else {
    plVar1 = (long *)(lVar10 + i * 0x30);
    memmove(plVar1 + 6,(void *)(lVar10 + i * 0x30),(*(long *)(this + 0x10) - i) * 0x30);
    *plVar1 = (long)pDVar5;
    plVar1[1] = (long)pcVar6;
    plVar1[2] = lVar3;
    plVar1[3] = (long)pDVar7;
    plVar1[4] = (long)pcVar8;
    plVar1[5] = lVar9;
  }
LAB_001a210c:
  *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }